

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_value_pointer_bug_t.c
# Opt level: O2

void test_one_ip(MMDB_s *mmdb,char *filename,char *mode_desc,char *ip,char *country_code)

{
  int iVar1;
  size_t len;
  ulong uVar2;
  char *__s1;
  ulong __n;
  MMDB_entry_data_s entry_data;
  MMDB_lookup_result_s result;
  
  lookup_string_ok(&result,mmdb,ip,filename,mode_desc);
  data_ok(&entry_data,&result,2,"country{iso_code}","country","iso_code",0);
  iVar1 = ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/get_value_pointer_bug_t.c"
                    ,0x20,(uint)entry_data.has_data,"found data for country{iso_code}",0);
  if (iVar1 != 0) {
    for (uVar2 = 0;
        (__n = (ulong)entry_data.data_size, entry_data.data_size != uVar2 &&
        (__n = uVar2, entry_data.field_1.utf8_string[uVar2] != '\0')); uVar2 = uVar2 + 1) {
    }
    __s1 = (char *)malloc(__n + 1);
    if (__s1 == (char *)0x0) {
      ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/get_value_pointer_bug_t.c"
                ,0x24,0,"mmdb_strndup() call failed",0);
      exit(1);
    }
    memcpy(__s1,entry_data.field_1.utf8_string,__n);
    __s1[__n] = '\0';
    iVar1 = strcmp(__s1,country_code);
    iVar1 = ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/get_value_pointer_bug_t.c"
                      ,0x29,(uint)(iVar1 == 0),"iso_code is %s",country_code,0);
    if (iVar1 == 0) {
      diag("  value is %s",__s1);
    }
    free(__s1);
  }
  return;
}

Assistant:

void test_one_ip(MMDB_s *mmdb,
                 const char *filename,
                 const char *mode_desc,
                 char *ip,
                 char *country_code) {
    MMDB_lookup_result_s result =
        lookup_string_ok(mmdb, ip, filename, mode_desc);

    MMDB_entry_data_s entry_data = data_ok(&result,
                                           MMDB_DATA_TYPE_UTF8_STRING,
                                           "country{iso_code}",
                                           "country",
                                           "iso_code",
                                           NULL);

    if (ok(entry_data.has_data, "found data for country{iso_code}")) {
        char *string =
            mmdb_strndup(entry_data.utf8_string, entry_data.data_size);
        if (!string) {
            ok(0, "mmdb_strndup() call failed");
            exit(1);
        }
        if (!ok(strcmp(string, country_code) == 0,
                "iso_code is %s",
                country_code)) {
            diag("  value is %s", string);
        }
        free(string);
    }
}